

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupArray(Vec_Ptr_t *vArray)

{
  undefined8 *puVar1;
  void *pvVar2;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  int iVar7;
  
  p = (Aig_Man_t *)0x0;
  if (vArray->nSize != 0) {
    puVar1 = (undefined8 *)Vec_PtrEntry(vArray,0);
    while (iVar6 = (int)p, iVar6 < vArray->nSize) {
      pvVar2 = Vec_PtrEntry(vArray,iVar6);
      if (*(int *)((long)pvVar2 + 0x68) != 0) {
        __assert_fail("Aig_ManRegNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                      ,0x4f1,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
      p = (Aig_Man_t *)(ulong)(iVar6 + 1);
      if (*(int *)((long)pvVar2 + 0x88) != *(int *)(puVar1 + 0x11)) {
        __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                      ,0x4f2,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
    }
    p = Aig_ManStart(10000);
    pcVar3 = Abc_UtilStrsav((char *)*puVar1);
    p->pName = pcVar3;
    for (iVar6 = 0; iVar6 < ((Vec_Ptr_t *)puVar1[2])->nSize; iVar6 = iVar6 + 1) {
      Vec_PtrEntry((Vec_Ptr_t *)puVar1[2],iVar6);
      Aig_ObjCreateCi(p);
    }
    for (iVar6 = 0; iVar6 < vArray->nSize; iVar6 = iVar6 + 1) {
      puVar1 = (undefined8 *)Vec_PtrEntry(vArray,iVar6);
      *(Aig_Obj_t **)(puVar1[6] + 0x28) = p->pConst1;
      for (iVar7 = 0; iVar7 < ((Vec_Ptr_t *)puVar1[2])->nSize; iVar7 = iVar7 + 1) {
        pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)puVar1[2],iVar7);
        pAVar4 = Aig_ManCi(p,iVar7);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
      }
      for (iVar7 = 0; iVar7 < ((Vec_Ptr_t *)puVar1[4])->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)puVar1[4],iVar7);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          p1 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And(p,pAVar5,p1);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      for (iVar7 = 0; iVar7 < ((Vec_Ptr_t *)puVar1[3])->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)puVar1[3],iVar7);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p,pAVar4);
      }
    }
    Aig_ManSetRegNum(p,*(int *)(puVar1 + 0xd));
    iVar6 = Aig_ManCheck(p);
    if (iVar6 == 0) {
      puts("Aig_ManDupSimple(): The check has failed.");
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManDupArray( Vec_Ptr_t * vArray )
{
    Aig_Man_t * p, * pNew;
    Aig_Obj_t * pObj;
    int i, k;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    p = (Aig_Man_t *)Vec_PtrEntry( vArray, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, pNew, k )
    {
        assert( Aig_ManRegNum(pNew) == 0 );
        assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(p) );
    }
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjCreateCi(pNew);
    // create the PIs
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, p, k )
    {
        Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
        Aig_ManForEachCi( p, pObj, i )
            pObj->pData = Aig_ManCi( pNew, i );
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}